

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::NodeLoader::begin__instance_material
          (NodeLoader *this,instance_material__AttributeData *attributeData)

{
  ClassId CVar1;
  MaterialBinding *this_00;
  FilePartLoader *__s;
  UniqueId *referencedMaterial;
  long in_RSI;
  HelperLoaderBase *in_RDI;
  bool in_stack_0000001b;
  ClassId in_stack_0000001c;
  URI *in_stack_00000020;
  IFilePartLoader *in_stack_00000028;
  MaterialId materialId;
  String *in_stack_ffffffffffffff08;
  MaterialBinding *this_01;
  String *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  allocator<char> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  allocator<char> local_71;
  string local_70 [35];
  byte local_4d;
  byte local_3a;
  allocator<char> local_39;
  string local_38 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  long local_10;
  
  if ((in_RDI[6]._vptr_HelperLoaderBase != (_func_int **)0x0) ||
     (in_RDI[6].mHandlingFilePartLoader != (FilePartLoader *)0x0)) {
    local_3a = 0;
    local_4d = 0;
    local_10 = in_RSI;
    if (*(long *)(in_RSI + 8) == 0) {
      local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      std::allocator<char>::allocator();
      local_3a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      local_4d = 1;
      local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 GeometryMaterialIdInfo::getMaterialId
                           ((GeometryMaterialIdInfo *)
                            CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                            in_stack_ffffffffffffff30);
    }
    if ((local_4d & 1) != 0) {
      std::__cxx11::string::~string(local_38);
    }
    if ((local_3a & 1) != 0) {
      std::allocator<char>::~allocator(&local_39);
    }
    local_18 = local_a8;
    this_00 = (MaterialBinding *)operator_new(0x68);
    __s = HelperLoaderBase::getHandlingFilePartLoader(in_RDI);
    referencedMaterial = (UniqueId *)(local_10 + 0x10);
    CVar1 = COLLADAFW::ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)389>::ID();
    IFilePartLoader::createUniqueIdFromUrl
              (in_stack_00000028,in_stack_00000020,in_stack_0000001c,in_stack_0000001b);
    COLLADAFW::MaterialBinding::MaterialBinding
              (this_00,(MaterialId *)CONCAT44(CVar1,in_stack_ffffffffffffff38),referencedMaterial);
    in_RDI[8].mHandlingFilePartLoader = (FilePartLoader *)this_00;
    if (*(long *)(local_10 + 8) != 0) {
      this_01 = (MaterialBinding *)in_RDI[8].mHandlingFilePartLoader;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_a8,(char *)__s,(allocator<char> *)this_00);
      COLLADAFW::MaterialBinding::setName(this_01,in_stack_ffffffffffffff08);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator(&local_71);
    }
  }
  return true;
}

Assistant:

bool NodeLoader::begin__instance_material( const instance_material__AttributeData& attributeData )
	{
        if ( mCurrentInstanceGeometry || mCurrentInstanceController )
        {
            COLLADAFW::MaterialId materialId = attributeData.symbol ? mCurrentMaterialInfo->getMaterialId((const char*)attributeData.symbol) : 0;
            mCurrentMaterialBinding = new COLLADAFW::MaterialBinding(materialId, getHandlingFilePartLoader()->createUniqueIdFromUrl(attributeData.target, COLLADAFW::Material::ID()));

            if ( attributeData.symbol )
                mCurrentMaterialBinding->setName((const char*)attributeData.symbol);
        }

		return true;
	}